

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

string<unsigned_short> * __thiscall
irr::core::string<unsigned_short>::operator=(string<unsigned_short> *this,char *c)

{
  char *pcVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  puVar2 = this->array;
  if (c == (char *)0x0) {
    if (puVar2 == (unsigned_short *)0x0) {
      puVar2 = (unsigned_short *)operator_new__(2);
      this->array = puVar2;
      this->allocated = 1;
      this->used = 1;
    }
    *puVar2 = 0;
  }
  else if (puVar2 != (unsigned_short *)c) {
    if (*c == '\0') {
      uVar6 = 1;
    }
    else {
      uVar6 = 1;
      do {
        pcVar1 = c + uVar6;
        uVar6 = uVar6 + 1;
      } while (*pcVar1 != '\0');
    }
    iVar5 = (int)uVar6;
    this->used = iVar5;
    this->allocated = iVar5;
    puVar3 = (unsigned_short *)operator_new__((ulong)(uint)(iVar5 * 2));
    this->array = puVar3;
    uVar4 = 0;
    do {
      this->array[uVar4] = (short)c[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar6 & 0xffffffff) != uVar4);
    if (puVar2 != (unsigned_short *)0x0) {
      operator_delete__(puVar2);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}